

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ImplicitNonAnsiPortSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ImplicitNonAnsiPortSyntax,slang::syntax::PortExpressionSyntax&>
          (BumpAllocator *this,PortExpressionSyntax *args)

{
  ImplicitNonAnsiPortSyntax *this_00;
  
  this_00 = (ImplicitNonAnsiPortSyntax *)allocate(this,0x18,8);
  slang::syntax::ImplicitNonAnsiPortSyntax::ImplicitNonAnsiPortSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }